

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseMemArray(Mem *p,int N)

{
  ulong uVar1;
  int in_ESI;
  ulong in_RDI;
  u8 malloc_failed;
  sqlite3 *db;
  Mem *pEnd;
  undefined7 in_stack_ffffffffffffffd8;
  u8 uVar2;
  sqlite3 *db_00;
  ulong local_8;
  
  if ((in_RDI != 0) && (in_ESI != 0)) {
    uVar1 = in_RDI + (long)in_ESI * 0x38;
    db_00 = *(sqlite3 **)(in_RDI + 0x28);
    uVar2 = db_00->mallocFailed;
    local_8 = in_RDI;
    if (db_00->pnBytesFreed == (int *)0x0) {
      do {
        if ((*(ushort *)(local_8 + 8) & 0x2460) == 0) {
          if (*(int *)(local_8 + 0x20) != 0) {
            sqlite3DbFree(db_00,(void *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
            *(undefined4 *)(local_8 + 0x20) = 0;
          }
        }
        else {
          sqlite3VdbeMemRelease((Mem *)0x138b0b);
        }
        *(undefined2 *)(local_8 + 8) = 0x80;
        local_8 = local_8 + 0x38;
      } while (local_8 < uVar1);
      db_00->mallocFailed = uVar2;
    }
    else {
      do {
        if (*(int *)(local_8 + 0x20) != 0) {
          sqlite3DbFree(db_00,(void *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
        }
        local_8 = local_8 + 0x38;
      } while (local_8 < uVar1);
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd = &p[N];
    sqlite3 *db = p->db;
    u8 malloc_failed = db->mallocFailed;
    if( db->pnBytesFreed ){
      do{
        if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
      }while( (++p)<pEnd );
      return;
    }
    do{
      assert( (&p[1])==pEnd || p[0].db==p[1].db );
      assert( sqlite3VdbeCheckMemInvariants(p) );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is 
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to 
      ** callgrind, this causes a certain test case to hit the CPU 4.7 
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if 
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table 
      ** with no indexes using a single prepared INSERT statement, bind() 
      ** and reset(). Inserts are grouped into a transaction.
      */
      testcase( p->flags & MEM_Agg );
      testcase( p->flags & MEM_Dyn );
      testcase( p->flags & MEM_Frame );
      testcase( p->flags & MEM_RowSet );
      if( p->flags&(MEM_Agg|MEM_Dyn|MEM_Frame|MEM_RowSet) ){
        sqlite3VdbeMemRelease(p);
      }else if( p->szMalloc ){
        sqlite3DbFree(db, p->zMalloc);
        p->szMalloc = 0;
      }

      p->flags = MEM_Undefined;
    }while( (++p)<pEnd );
    db->mallocFailed = malloc_failed;
  }
}